

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void com_df_set_edge_hor(com_map_t *map,int i_scu,com_ref_pic_t (*refp) [2],int scu_x,int pix_y,
                        int cuw,int edgecondition)

{
  s8 asVar1 [2];
  s8 asVar2 [2];
  s8 (*pasVar3) [2];
  u8 *puVar4;
  s16 (*paasVar5) [2] [2];
  int iVar6;
  com_pic_t *pcVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  long lVar12;
  com_pic_t *pcVar13;
  int iVar14;
  com_pic_t *pcVar15;
  ushort uVar16;
  com_pic_t *pcVar17;
  bool bVar18;
  
  pasVar3 = map->map_refi;
  lVar12 = (long)(pix_y * i_scu + scu_x);
  if ((long)pasVar3[lVar12][0] < 0) {
    pcVar13 = (com_pic_t *)0x0;
  }
  else {
    pcVar13 = refp[pasVar3[lVar12][0]][0].pic;
  }
  if ((long)pasVar3[lVar12][1] < 0) {
    pcVar7 = (com_pic_t *)0x0;
  }
  else {
    pcVar7 = refp[pasVar3[lVar12][1]][1].pic;
  }
  puVar4 = map->map_edge;
  iVar6 = scu_x + i_scu * (pix_y + -1);
  lVar9 = lVar12;
  do {
    bVar18 = cuw == 0;
    cuw = cuw + -1;
    if (bVar18) {
      return;
    }
    if (((byte)map->map_scu[iVar6] & 0x12) == 0) {
      asVar1 = pasVar3[lVar12];
      asVar2 = map->map_refi[iVar6];
      if (asVar1 != asVar2) {
        if (asVar2[0] < '\0') {
          pcVar15 = (com_pic_t *)0x0;
        }
        else {
          pcVar15 = *(com_pic_t **)((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6));
        }
        if ((short)asVar2 < 0) {
          pcVar17 = (com_pic_t *)0x0;
        }
        else {
          pcVar17 = refp[(ushort)asVar2 >> 8][1].pic;
        }
        if ((pcVar17 == pcVar13) && (pcVar15 == pcVar7)) {
          paasVar5 = map->map_mv;
          if (asVar1[0] < '\0') {
LAB_00112787:
            if (-1 < (short)asVar1) {
              iVar8 = (int)paasVar5[lVar9][1][0] - (int)paasVar5[iVar6][0][0];
              iVar14 = -iVar8;
              if (0 < iVar8) {
                iVar14 = iVar8;
              }
              if (3 < (ushort)iVar14) goto LAB_00112631;
              iVar8 = (int)paasVar5[lVar9][1][1] - (int)paasVar5[iVar6][0][1];
              iVar14 = -iVar8;
              if (0 < iVar8) {
                iVar14 = iVar8;
              }
              uVar11 = (ushort)iVar14;
              goto joined_r0x001127cd;
            }
            goto LAB_001127d3;
          }
          iVar14 = (int)paasVar5[lVar9][0][0] - (int)paasVar5[iVar6][1][0];
          uVar11 = (ushort)iVar14;
          uVar16 = -uVar11;
          if (0 < iVar14) {
            uVar16 = uVar11;
          }
          if (uVar16 < 4) {
            iVar14 = (int)paasVar5[lVar9][0][1] - (int)paasVar5[iVar6][1][1];
            uVar11 = (ushort)iVar14;
            uVar16 = -uVar11;
            if (0 < iVar14) {
              uVar16 = uVar11;
            }
            if (uVar16 < 4) goto LAB_00112787;
          }
        }
        goto LAB_00112631;
      }
      paasVar5 = map->map_mv;
      if (-1 < asVar1[0]) {
        iVar14 = (int)paasVar5[lVar9][0][0] - (int)paasVar5[iVar6][0][0];
        uVar11 = (ushort)iVar14;
        uVar16 = -uVar11;
        if (0 < iVar14) {
          uVar16 = uVar11;
        }
        if (uVar16 < 4) {
          iVar14 = (int)paasVar5[lVar9][0][1] - (int)paasVar5[iVar6][0][1];
          uVar11 = (ushort)iVar14;
          uVar16 = -uVar11;
          if (0 < iVar14) {
            uVar16 = uVar11;
          }
          if (uVar16 < 4) goto LAB_0011269e;
        }
        goto LAB_00112631;
      }
LAB_0011269e:
      if (-1 < (short)asVar1) {
        iVar8 = (int)paasVar5[lVar9][1][0] - (int)paasVar5[iVar6][1][0];
        iVar14 = -iVar8;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        if ((ushort)iVar14 < 4) {
          iVar8 = (int)paasVar5[lVar9][1][1] - (int)paasVar5[iVar6][1][1];
          iVar14 = -iVar8;
          if (0 < iVar8) {
            iVar14 = iVar8;
          }
          uVar11 = (ushort)iVar14;
joined_r0x001127cd:
          if (uVar11 < 4) goto LAB_001127d3;
        }
        goto LAB_00112631;
      }
LAB_001127d3:
      bVar10 = 0;
    }
    else {
LAB_00112631:
      bVar10 = 4;
    }
    puVar4[lVar9] = puVar4[lVar9] | bVar10;
    iVar6 = iVar6 + 1;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

static void uavs3d_always_inline com_df_set_edge_hor_inline(com_map_t *map, int i_scu, com_ref_pic_t refp[MAX_REFS][REFP_NUM], int scu_x, int scu_y, int w, int edgecondition)
{
    int scup = scu_y * i_scu + scu_x;
    u8 *edge_filter = map->map_edge + scup;
    s8 *refi_p = map->map_refi[scup];
    com_pic_t *p_pic0 = REFI_IS_VALID(refi_p[REFP_0]) ? refp[refi_p[REFP_0]][REFP_0].pic : NULL;
    com_pic_t *p_pic1 = REFI_IS_VALID(refi_p[REFP_1]) ? refp[refi_p[REFP_1]][REFP_1].pic : NULL;

    edgecondition <<= 2;

    while (w--) {
        *edge_filter++ |= skip_filter(map, refp, refi_p, p_pic0, p_pic1, scup++, -i_scu) ? 0 : edgecondition;
    }
}